

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O1

void __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::generic_set_entry_rel<ELFIO::Elf64_Rel>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr offset,Elf_Word symbol,uint type,Elf_Sxword param_5)

{
  elfio *peVar1;
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  long lVar5;
  
  peVar1 = this->elf_file;
  iVar3 = (*this->relocation_section->_vptr_section[0x18])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->relocation_section->_vptr_section[0xf])();
  _Var2._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (elf_header *)0x0) {
    iVar4 = (*(_Var2._M_head_impl)->_vptr_elf_header[4])();
    if ((char)iVar4 == '\x01') {
      uVar9 = (ulong)symbol << 8;
      type = type & 0xff;
      goto LAB_00109546;
    }
  }
  uVar9 = (ulong)symbol << 0x20;
LAB_00109546:
  lVar8 = CONCAT44(extraout_var_00,iVar3) * index;
  uVar6 = type | uVar9;
  *(ulong *)(lVar5 + 8 + lVar8) = uVar6;
  *(Elf64_Addr *)(lVar5 + lVar8) = offset;
  bVar10 = (peVar1->convertor).need_conversion == false;
  uVar7 = offset >> 0x38 | (offset & 0xff000000000000) >> 0x28 | (offset & 0xff0000000000) >> 0x18 |
          (offset & 0xff00000000) >> 8 | (offset & 0xff000000) << 8 | (offset & 0xff0000) << 0x18 |
          (offset & 0xff00) << 0x28 | offset << 0x38;
  if (bVar10) {
    uVar7 = offset;
  }
  *(ulong *)(lVar5 + lVar8) = uVar7;
  uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
          (uVar9 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | (ulong)type << 0x38;
  if (bVar10) {
    uVar9 = uVar6;
  }
  *(ulong *)(lVar5 + 8 + lVar8) = uVar9;
  return;
}

Assistant:

void generic_set_entry_rel( Elf_Xword  index,
                                Elf64_Addr offset,
                                Elf_Word   symbol,
                                unsigned   type,
                                Elf_Sxword )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        T* pEntry = const_cast<T*>( reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() ) );

        if ( elf_file.get_class() == ELFCLASS32 ) {
            pEntry->r_info = ELF32_R_INFO( (Elf_Xword)symbol, type );
        }
        else {
            pEntry->r_info = ELF64_R_INFO( (Elf_Xword)symbol, type );
        }
        pEntry->r_offset = decltype( pEntry->r_offset )( offset );
        pEntry->r_offset = convertor( pEntry->r_offset );
        pEntry->r_info   = convertor( pEntry->r_info );
    }